

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O0

bool dg::vr::RelationsGraph<dg::vr::ValueRelations>::processEdge
               (RelationEdge *edge,Type strictRel,Relations *updated,bool toFirstStrict,
               Visited *firstStrictEdges)

{
  Type TVar1;
  ulong uVar2;
  byte in_CL;
  Relations *in_RDX;
  Type in_ESI;
  RelationEdge *in_RDI;
  bool thisIsFSE;
  bool targetOfFSE;
  undefined4 in_stack_ffffffffffffff98;
  undefined1 v;
  Type in_stack_ffffffffffffff9c;
  Relations *in_stack_ffffffffffffffa0;
  _Self local_48;
  _Self local_40;
  undefined1 local_32;
  undefined1 local_31;
  byte local_21;
  Relations *local_20;
  Type local_14;
  bool local_1;
  
  local_21 = in_CL & 1;
  local_20 = in_RDX;
  local_14 = in_ESI;
  TVar1 = Bucket::RelationEdge::rel(in_RDI);
  uVar2 = dg::vr::Relations::transitiveOver(in_ESI,TVar1);
  if ((uVar2 & 1) == 0) {
    local_1 = true;
  }
  else if ((local_21 & 1) == 0) {
    Relations::set(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                   SUB41((uint)in_stack_ffffffffffffff98 >> 0x18,0));
    local_1 = false;
  }
  else {
    local_31 = Relations::has(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    if ((bool)local_31) {
      local_40._M_node =
           (_Base_ptr)
           std::
           set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
           ::find((set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
                   *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                  (key_type *)0x1e0600);
      local_48._M_node =
           (_Base_ptr)
           std::
           set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
           ::end((set<dg::vr::Bucket::RelationEdge,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
                  *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      v = (undefined1)((uint)in_stack_ffffffffffffff98 >> 0x18);
      local_32 = std::operator!=(&local_40,&local_48);
      if ((bool)local_32) {
        Relations::set(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,(bool)v);
        dg::vr::Relations::getNonStrict(local_14);
        Relations::set(local_20,in_stack_ffffffffffffff9c,(bool)v);
      }
      local_1 = true;
    }
    else {
      dg::vr::Relations::getNonStrict(local_14);
      Relations::set(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                     SUB41((uint)in_stack_ffffffffffffff98 >> 0x18,0));
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool processEdge(const Bucket::RelationEdge &edge,
                            Relations::Type strictRel, Relations &updated,
                            bool toFirstStrict,
                            const Bucket::iterator::Visited &firstStrictEdges) {
        if (!Relations::transitiveOver(strictRel,
                                       edge.rel())) // edge not relevant
            return true;
        if (!toFirstStrict) { // finding all strictly related
            updated.set(strictRel);
            return false;
        }
        // else unsetting all that are not really first strict

        bool targetOfFSE = updated.has(strictRel); // FSE = first strict edge

        if (!targetOfFSE) {
            updated.set(Relations::getNonStrict(strictRel), false);
            return false;
        }

        // else possible false strict
        bool thisIsFSE = firstStrictEdges.find(edge) != firstStrictEdges.end();

        if (thisIsFSE) { // strict relation set by false first strict
            updated.set(strictRel, false);
            updated.set(Relations::getNonStrict(strictRel), false);
        }
        return true; // skip because search will happen from target sooner or
                     // later
    }